

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatEdge.c
# Opt level: O2

void Seg_ManClean(Seg_Man_t *p)

{
  abctime aVar1;
  
  aVar1 = Abc_Clock();
  p->timeStart = aVar1;
  sat_solver_rollback(p->pSat);
  sat_solver_bookmark(p->pSat);
  p->vEdges->nSize = 0;
  p->vFirsts->nSize = 0;
  p->vNvars->nSize = 0;
  p->vLits->nSize = 0;
  p->vPolars->nSize = 0;
  p->vToSkip->nSize = 0;
  Gia_ManFillValue(p->pGia);
  return;
}

Assistant:

void Seg_ManClean( Seg_Man_t * p )
{
    p->timeStart = Abc_Clock();
    sat_solver_rollback( p->pSat );
    sat_solver_bookmark( p->pSat );
    // internal
    Vec_IntClear( p->vEdges );
    Vec_IntClear( p->vFirsts );
    Vec_IntClear( p->vNvars );
    Vec_IntClear( p->vLits );
    Vec_IntClear( p->vPolars );
    Vec_IntClear( p->vToSkip );
    // other
    Gia_ManFillValue( p->pGia );
}